

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmake *pcVar3;
  cmMakefile *this_00;
  cmExternalMakefileProjectGenerator *pcVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  pointer puVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  PolicyID id;
  PolicyID id_00;
  ulong uVar11;
  char *__end;
  ostringstream msg;
  undefined1 local_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  cmake *local_1c0;
  long local_1b8;
  long local_1b0;
  undefined1 local_1a8 [24];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  lVar7 = std::chrono::_V2::steady_clock::now();
  (*this->_vptr_cmGlobalGenerator[0x41])(this);
  ProcessEvaluationFiles(this);
  pcVar3 = this->CMakeInstance;
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Generating","");
  cmake::UpdateProgress(pcVar3,(string *)local_1a8,0.1);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar5 = cmQtAutoGenGlobalInitializer::SetupCustomTargets
                    ((this->QtAutoGen)._M_t.
                     super___uniq_ptr_impl<cmQtAutoGenGlobalInitializer,_std::default_delete<cmQtAutoGenGlobalInitializer>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmQtAutoGenGlobalInitializer_*,_std::default_delete<cmQtAutoGenGlobalInitializer>_>
                     .super__Head_base<0UL,_cmQtAutoGenGlobalInitializer_*,_false>._M_head_impl);
  if (bVar5) {
    puVar8 = (this->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1b8 = lVar7;
    if ((this->LocalGenerators).
        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar8) {
      uVar11 = 0;
      do {
        this->CurrentConfigureMakefile =
             (puVar8[uVar11]._M_t.
              super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
              super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
              super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
        (**(code **)((long)((puVar8[uVar11]._M_t.
                             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                             .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                           super_cmOutputConverter)._vptr_cmOutputConverter + 0x18))();
        this_00 = *(cmMakefile **)
                   ((long)(this->LocalGenerators).
                          super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                          super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                          ._M_t + 0x70);
        local_1a8._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"CMAKE_SKIP_INSTALL_RULES","");
        bVar5 = cmMakefile::IsOn(this_00,(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (!bVar5) {
          cmLocalGenerator::GenerateInstallRules
                    ((cmLocalGenerator *)
                     (this->LocalGenerators).
                     super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                     super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>
                     ._M_t);
        }
        cmLocalGenerator::GenerateTestFiles
                  ((cmLocalGenerator *)
                   (this->LocalGenerators).
                   super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t);
        pcVar3 = this->CMakeInstance;
        local_1a8._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Generating","");
        cmake::UpdateProgress
                  (pcVar3,(string *)local_1a8,
                   (((float)uVar11 + 1.0) * 0.9) /
                   (float)(ulong)((long)(this->LocalGenerators).
                                        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->LocalGenerators).
                                        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) + 0.1);
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        puVar8 = (this->LocalGenerators).
                 super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 3
                               ));
    }
    this->CurrentConfigureMakefile = (cmMakefile *)0x0;
    GenerateCPackPropertiesFile(this);
    p_Var9 = (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        bVar5 = cmExportFileGenerator::GenerateImportFile(*(cmExportFileGenerator **)(p_Var9 + 2));
        if (!bVar5) {
          if (((cmSystemTools::s_ErrorOccurred == false) &&
              (cmSystemTools::s_FatalErrorOccurred == false)) &&
             (bVar6 = cmSystemTools::GetInterruptFlag(), !bVar6)) {
            local_1c0 = this->CMakeInstance;
            local_1a8._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"Could not write export file.","");
            local_1f8._0_8_ = (element_type *)0x0;
            local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1f8);
            cmake::IssueMessage(local_1c0,FATAL_ERROR,(string *)local_1a8,
                                (cmListFileBacktrace *)local_1f8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
            }
            if ((pointer)local_1a8._0_8_ != pcVar2) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
          }
          if (!bVar5) {
            return;
          }
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    CheckRuleHashes(this);
    WriteSummary(this);
    pcVar4 = (this->ExtraGenerator)._M_t.
             super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
             .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl;
    if (pcVar4 != (cmExternalMakefileProjectGenerator *)0x0) {
      (*pcVar4->_vptr_cmExternalMakefileProjectGenerator[4])();
    }
    CheckTargetLinkLibraries(this);
    if ((this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1f8,(cmPolicies *)0x2a,id);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"MACOSX_RPATH is not specified for the following targets:\n",
                 0x39);
      p_Var9 = (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      pcVar3 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      local_1d8._M_allocated_capacity = 0;
      local_1d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1d8);
      cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1f8,
                          (cmListFileBacktrace *)&local_1d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
      }
      if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    if ((this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_1f8,(cmPolicies *)0x44,id_00);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(char *)local_1f8._0_8_,local_1f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,
                 "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                 ,0x89);
      if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      p_Var9 = (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
      pcVar3 = this->CMakeInstance;
      std::__cxx11::stringbuf::str();
      local_1d8._M_allocated_capacity = 0;
      local_1d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_1d8);
      cmake::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_1f8,
                          (cmListFileBacktrace *)&local_1d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
      }
      if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    lVar7 = std::chrono::_V2::steady_clock::now();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Generating done (",0x11);
    local_1b0 = (lVar7 - local_1b8) / 1000000;
    *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8._0_8_ + -0x18)) & 0xfffffefb | 4;
    *(undefined8 *)(local_1a8 + *(long *)(local_1a8._0_8_ + -0x18) + 8) = 1;
    poVar10 = std::ostream::_M_insert<long_double>((longdouble)local_1b0 / (longdouble)1000.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"s)",2);
    pcVar3 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar3,(string *)local_1f8,-1.0);
    if ((element_type *)local_1f8._0_8_ != (element_type *)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else if (((cmSystemTools::s_ErrorOccurred == false) &&
           (cmSystemTools::s_FatalErrorOccurred == false)) &&
          (bVar5 = cmSystemTools::GetInterruptFlag(), !bVar5)) {
    pcVar3 = this->CMakeInstance;
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Problem setting up custom targets for QtAutoGen","");
    local_1f8._0_8_ = (element_type *)0x0;
    local_1f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_1f8);
    cmake::IssueMessage(pcVar3,FATAL_ERROR,(string *)local_1a8,(cmListFileBacktrace *)local_1f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    }
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  auto startTime = std::chrono::steady_clock::now();

  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  this->CMakeInstance->UpdateProgress("Generating", 0.1f);

#ifndef CMAKE_BOOTSTRAP
  if (!this->QtAutoGen->SetupCustomTargets()) {
    if (!cmSystemTools::GetErrorOccurredFlag()) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Problem setting up custom targets for QtAutoGen");
    }
    return;
  }
#endif

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      0.1f +
        0.9f * (static_cast<float>(i) + 1.0f) /
          static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccurredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  // Perform validation checks on memoized link structures.
  this->CheckTargetLinkLibraries();

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  auto endTime = std::chrono::steady_clock::now();
  auto ms =
    std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime);
  std::ostringstream msg;
  msg << "Generating done (" << std::fixed << std::setprecision(1)
      << ms.count() / 1000.0L << "s)";
  this->CMakeInstance->UpdateProgress(msg.str(), -1);
}